

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void push_object(loc grid)

{
  object *poVar1;
  bool bVar2;
  object *poVar3;
  _Bool _Var4;
  wchar_t wVar5;
  object *dest;
  loc lVar6;
  object *poVar7;
  size_t sVar8;
  monster *pmVar9;
  wchar_t d;
  queue *q;
  _Bool dummy;
  object *obj;
  loc newgrid;
  _Bool local_61;
  object *local_60;
  loc local_58;
  queue *local_50;
  loc local_48;
  trap *local_40;
  feature *local_38;
  
  local_38 = square_feat(cave,grid);
  local_60 = square_object(cave,grid);
  local_50 = q_new((ulong)z_info->floor_size);
  local_58 = grid;
  local_40 = square_trap(cave,grid);
  poVar3 = local_60;
  lVar6 = local_58;
  while (local_60 = poVar3, local_58 = lVar6, poVar3 != (object *)0x0) {
    poVar1 = poVar3->next;
    dest = (object *)mem_alloc(0x148);
    memcpy(dest,&OBJECT_NULL,0x148);
    object_copy(dest,poVar3);
    dest->oidx = 0;
    lVar6 = (loc)loc(0,0);
    dest->grid = lVar6;
    if (dest->known != (object *)0x0) {
      poVar7 = (object *)mem_alloc(0x148);
      memcpy(poVar7,&OBJECT_NULL,0x148);
      dest->known = poVar7;
      object_copy(poVar7,poVar3->known);
      poVar7 = dest->known;
      poVar7->oidx = 0;
      lVar6 = (loc)loc(0,0);
      poVar7->grid = lVar6;
    }
    q_push(local_50,(uintptr_t)dest);
    delist_object(cave,poVar3);
    object_delete((chunk *)cave,(chunk *)player->cave,&local_60);
    poVar3 = poVar1;
    lVar6 = local_58;
  }
  square_set_obj(cave,lVar6,(object *)0x0);
  square_force_floor(cave,lVar6);
  square_add_door(cave,lVar6,false);
  q = local_50;
  sVar8 = q_len(local_50);
  if (sVar8 != 0) {
    do {
      local_60 = (object *)q_pop(q);
      if (local_60->mimicking_m_idx == 0) {
        drop_near((chunk *)cave,&local_60,L'\0',local_58,false,false);
      }
      else {
        pmVar9 = cave_monster(cave,(int)local_60->mimicking_m_idx);
        if (pmVar9 == (monster *)0x0) {
          __assert_fail("mimic",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                        ,0x4c2,"void push_object(struct loc)");
        }
        pmVar9->mimicked_obj = (object *)0x0;
        d = L'\x01';
        do {
          poVar3 = local_60;
          local_61 = true;
          if (d < L'\x04') {
            wVar5 = scatter_ext(cave,&local_48,L'\x01',local_58,d,true,square_isempty);
            poVar3 = local_60;
            if ((L'\0' < wVar5) &&
               (_Var4 = floor_carry((chunk *)cave,local_48,local_60,&local_61), _Var4)) {
              monster_swap(local_58,local_48);
              pmVar9->mimicked_obj = poVar3;
              goto LAB_001ac529;
            }
            d = d + L'\x01';
            bVar2 = true;
          }
          else {
            delete_monster_idx((chunk *)cave,(int)local_60->mimicking_m_idx);
            if (poVar3->known != (object *)0x0) {
              object_delete((chunk *)player->cave,(chunk *)0x0,&poVar3->known);
            }
            object_delete((chunk *)cave,(chunk *)player->cave,&local_60);
LAB_001ac529:
            bVar2 = false;
          }
        } while (bVar2);
      }
      q = local_50;
      sVar8 = q_len(local_50);
    } while (sVar8 != 0);
  }
  lVar6 = local_58;
  square_set_feat(cave,local_58,local_38->fidx);
  if ((local_40 != (trap *)0x0) && (_Var4 = square_istrappable(cave,lVar6), !_Var4)) {
    square_destroy_trap(cave,lVar6);
  }
  q_free(q);
  return;
}

Assistant:

void push_object(struct loc grid)
{
	/* Save the original terrain feature */
	struct feature *feat_old = square_feat(cave, grid);
	struct object *obj = square_object(cave, grid);
	struct queue *queue = q_new(z_info->floor_size);
	struct trap *trap = square_trap(cave, grid);

	/* Push all objects on the square, stripped of pile info, into the queue */
	while (obj) {
		struct object *next = obj->next;
		/* In case the object is known, make a copy to work with
		 * and try to delete the original which will orphan it to
		 * serve as a placeholder for the known version. */
		struct object *newobj = object_new();

		object_copy(newobj, obj);
		newobj->oidx = 0;
		newobj->grid = loc(0, 0);
		if (newobj->known) {
			newobj->known = object_new();
			object_copy(newobj->known, obj->known);
			newobj->known->oidx = 0;
			newobj->known->grid = loc(0, 0);
		}
		q_push_ptr(queue, newobj);

		delist_object(cave, obj);
		object_delete(cave, player->cave, &obj);

		/* Next object */
		obj = next;
	}

	/* Disassociate the objects from the square */
	square_set_obj(cave, grid, NULL);

	/* Set feature to an open door */
	square_force_floor(cave, grid);
	square_add_door(cave, grid, false);

	/* Drop objects back onto the floor */
	while (q_len(queue) > 0) {
		/* Take object from the queue */
		obj = q_pop_ptr(queue);

		/* Unrevealed mimics require special handling, as always. */
		if (obj->mimicking_m_idx) {
			struct monster *mimic =
				cave_monster(cave, obj->mimicking_m_idx);
			int d;

			assert(mimic);
			/*
			 * Reset since the current value is a dangling
			 * reference to a deleted object.
			 */
			mimic->mimicked_obj = NULL;

			/* Try to find a location; use closer grids first. */
			d = 1;
			while (1) {
				struct loc newgrid;
				bool dummy = true;

				if (d >= 4) {
					/*
					 * Give up.  Destroy both the mimic
					 * and the object.
					 */
					delete_monster_idx(cave, obj->mimicking_m_idx);
					if (obj->known) {
						object_delete(player->cave, NULL, &obj->known);
					}
					object_delete(cave, player->cave, &obj);
					break;
				}
				if (scatter_ext(cave, &newgrid, 1, grid, d,
						true, square_isempty) > 0
						&& floor_carry(cave, newgrid,
						obj, &dummy)) {
					/*
					 * Move the monster and give it the
					 * object.
					 */
					monster_swap(grid, newgrid);
					mimic->mimicked_obj = obj;
					break;
				}
				++d;
			}
		} else {
			/* Drop the object */
			drop_near(cave, &obj, 0, grid, false, false);
		}
	}

	/* Reset cave feature, remove trap if needed */
	square_set_feat(cave, grid, feat_old->fidx);
	if (trap && !square_istrappable(cave, grid)) {
		square_destroy_trap(cave, grid);
	}

	q_free(queue);
}